

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

HRESULT __thiscall
Js::SourceTextModuleRecord::ParseSource
          (SourceTextModuleRecord *this,byte *sourceText,uint32 sourceLength,SRCINFO *srcInfo,
          Var *exceptionVar,bool isUtf8)

{
  Var value;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptConfiguration *this_00;
  JavascriptLibrary *pJVar4;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar5;
  JavascriptPromise **ppJVar6;
  char16 *pcVar7;
  Recycler *pRVar8;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar9;
  Parser *this_01;
  ParseNodeProg *ptr;
  ParseNodeProg **ppPVar10;
  JavascriptError *pJVar11;
  void **ppvVar12;
  ScriptContext **ppSVar13;
  ThreadContext *pTVar14;
  HostScriptContext *pHVar15;
  Data local_1d4;
  undefined1 local_1d0 [4];
  Data __exceptionCheck;
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  char16 *local_188;
  WCHAR *sourceUrl;
  OutOfMemoryException anon_var_0;
  Utf8SourceInfo *pUStack_178;
  StackOverflowException anon_var_0_1;
  Utf8SourceInfo *pResultSourceInfo;
  LoadScriptFlag loadScriptFlag;
  TrackAllocData local_158;
  AutoNestedHandledExceptionType local_12c;
  JavascriptError *pJStack_128;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JavascriptError *pError_1;
  TrackAllocData local_110;
  char16_t *local_e8;
  char16 *allocatedString;
  size_t length;
  char16 *moduleName;
  JavascriptError *local_c8;
  JavascriptError *pError;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_b0;
  ArenaAllocator *allocator;
  CompileScriptException se;
  ScriptContext *scriptContext;
  HRESULT hr;
  bool isUtf8_local;
  Var *exceptionVar_local;
  SRCINFO *srcInfo_local;
  uint32 sourceLength_local;
  byte *sourceText_local;
  SourceTextModuleRecord *this_local;
  
  if (((this->wasParsed & 1U) != 0) && (sourceText != (byte *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x52,"(!wasParsed || sourceText == nullptr)",
                                "!wasParsed || sourceText == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->parser != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x53,"(parser == nullptr)","parser == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (exceptionVar == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x54,"(exceptionVar != nullptr)","exceptionVar != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((sourceText == (byte *)0x0) && ((this->wasParsed & 1U) != 0)) {
    return 0;
  }
  se.bstrLine = (BSTR)GetScriptContext(this);
  CompileScriptException::CompileScriptException((CompileScriptException *)&allocator);
  local_b0 = &ScriptContext::GeneralAllocator((ScriptContext *)se.bstrLine)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  *exceptionVar = (Var)0x0;
  this_00 = ScriptContext::GetConfig((ScriptContext *)se.bstrLine);
  bVar2 = ScriptConfiguration::IsES6ModuleEnabled(this_00);
  if (bVar2) {
    ppLVar5 = Memory::WriteBarrierPtr::operator_cast_to_List__
                        ((WriteBarrierPtr *)&this->parentModuleList);
    if ((*ppLVar5 ==
         (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0) &&
       (ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromise__
                            ((WriteBarrierPtr *)&this->promise),
       *ppJVar6 == (JavascriptPromise *)0x0)) {
      SetIsRootModule(this);
    }
    if (sourceText == (byte *)0x0) {
      if (sourceLength != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x73,"(sourceLength == 0)","sourceLength == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pcVar7 = GetSpecifierSz(this);
      Output::TraceWithFlush(ModulePhase,L"Failed to load: %s\n",pcVar7);
      scriptContext._0_4_ = -0x7fffbffb;
      length = (size_t)GetSpecifierSz(this);
      allocatedString = (char16 *)PAL_wcslen((char16_t *)length);
      pRVar8 = ScriptContext::GetRecycler((ScriptContext *)se.bstrLine);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_110,(type_info *)&char16_t::typeinfo,0,(long)allocatedString + 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                 ,0x7a);
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_110);
      local_e8 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (long)allocatedString + 1);
      wmemcpy_s(local_e8,(long)allocatedString + 1,(char16 *)length,(size_t)allocatedString);
      local_e8[(long)allocatedString] = L'\0';
      pJVar4 = ScriptContext::GetLibrary((ScriptContext *)se.bstrLine);
      pJStack_128 = JavascriptLibrary::CreateURIError(pJVar4);
      JavascriptError::SetErrorMessageProperties
                (pJStack_128,-0x7fffbffb,local_e8,(ScriptContext *)se.bstrLine);
      *exceptionVar = pJStack_128;
    }
    else {
      pcVar7 = GetSpecifierSz(this);
      Output::TraceWithFlush(ModulePhase,L"ParseSource(%s)\n",pcVar7);
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (&local_12c,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      pAVar9 = local_b0;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_158,(type_info *)&Parser::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                 ,0x88);
      pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar9,&local_158);
      this_01 = (Parser *)new<Memory::ArenaAllocator>(0xaa8,(ArenaAllocator *)pAVar9,0x3f67b0);
      Parser::Parser(this_01,(ScriptContext *)se.bstrLine,0,(PageAllocator *)0x0,false,0xaa8);
      this->parser = this_01;
      srcInfo->moduleID = this->moduleId;
      pUStack_178 = (Utf8SourceInfo *)0x0;
      ptr = ScriptContext::ParseScript
                      ((ScriptContext *)se.bstrLine,this->parser,sourceText,(ulong)sourceLength,
                       srcInfo,(CompileScriptException *)&allocator,&stack0xfffffffffffffe88,
                       L"Module code",
                       (isUtf8 & 1) << 6 |
                       (LoadScriptFlag_Module|LoadScriptFlag_disableAsmJs|LoadScriptFlag_Expression)
                       ,&this->sourceIndex,(Var)0x0);
      Memory::WriteBarrierPtr<ParseNodeProg>::operator=(&this->parseTree,ptr);
      Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator=(&this->pSourceInfo,pUStack_178);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_12c);
      ppPVar10 = Memory::WriteBarrierPtr::operator_cast_to_ParseNodeProg__
                           ((WriteBarrierPtr *)&this->parseTree);
      if (*ppPVar10 == (ParseNodeProg *)0x0) {
        scriptContext._0_4_ = -0x7fffbffb;
      }
      else {
        scriptContext._0_4_ = PostParseProcess(this);
        if ((((HRESULT)scriptContext == 0) &&
            (ppvVar12 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                  ((WriteBarrierPtr *)&this->errorObject), *ppvVar12 != (void *)0x0)
            ) && ((this->hadNotifyHostReady & 1U) != 0)) {
          if (*exceptionVar == (Var)0x0) {
            ppvVar12 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                 ((WriteBarrierPtr *)&this->errorObject);
            *exceptionVar = *ppvVar12;
          }
          ReleaseParserResourcesForHierarchy(this);
          this_local._4_4_ = -0x7fffbffb;
          goto LAB_010153b2;
        }
      }
    }
    if ((HRESULT)scriptContext < 0) {
      if (*exceptionVar == (Var)0x0) {
        local_188 = GetSpecifierSz(this);
        pJVar11 = JavascriptError::CreateFromCompileScriptException
                            ((ScriptContext *)se.bstrLine,(CompileScriptException *)&allocator,
                             local_188);
        *exceptionVar = pJVar11;
      }
      ReleaseParserResourcesForHierarchy(this);
      if (this->parser != (Type)0x0) {
        __frameAddr = (void *)0x0;
        Memory::WriteBarrierPtr<ParseNodeProg>::operator=(&this->parseTree,&__frameAddr);
        Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Parser>
                  ((AllocatorType *)local_b0,this->parser);
        this->parser = (Type)0x0;
      }
      ppvVar12 = Memory::WriteBarrierPtr::operator_cast_to_void__
                           ((WriteBarrierPtr *)&this->errorObject);
      if (*ppvVar12 == (void *)0x0) {
        Memory::WriteBarrierPtr<void>::operator=(&this->errorObject,*exceptionVar);
      }
      ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromise__
                          ((WriteBarrierPtr *)&this->promise);
      if (*ppJVar6 != (JavascriptPromise *)0x0) {
        ppvVar12 = Memory::WriteBarrierPtr::operator_cast_to_void__
                             ((WriteBarrierPtr *)&this->errorObject);
        value = *ppvVar12;
        ppSVar13 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                             ((WriteBarrierPtr *)&this->scriptContext);
        ResolveOrRejectDynamicImportPromise(false,value,*ppSVar13,this,false);
      }
      if (((this->isRootModule & 1U) != 0) && ((this->hadNotifyHostReady & 1U) == 0)) {
        pcVar7 = GetSpecifierSz(this);
        Output::TraceWithFlush
                  (ModulePhase,L"\t>NotifyHostAboutModuleReady %s (ParseSource error)\n",pcVar7);
        pTVar14 = ScriptContext::GetThreadContext((ScriptContext *)se.bstrLine);
        bVar2 = ThreadContext::IsScriptActive(pTVar14);
        if (bVar2) {
          LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)
                     &autoReentrancyHandler.m_savedReentrancySafeOrHandled,
                     (ScriptContext *)se.bstrLine,&stack0xfffffffffffffff8);
          pTVar14 = ScriptContext::GetThreadContext((ScriptContext *)se.bstrLine);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_1d0,pTVar14);
          pHVar15 = ScriptContext::GetHostScriptContext((ScriptContext *)se.bstrLine);
          ppvVar12 = Memory::WriteBarrierPtr::operator_cast_to_void__
                               ((WriteBarrierPtr *)&this->errorObject);
          (*pHVar15->_vptr_HostScriptContext[0x14])(pHVar15,this,*ppvVar12);
          if (se.bstrLine != (BSTR)0x0) {
            pTVar14 = ScriptContext::GetThreadContext((ScriptContext *)se.bstrLine);
            ThreadContext::DisposeOnLeaveScript(pTVar14);
          }
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_1d0);
          LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)
                     &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
        }
        else {
          local_1d4 = ExceptionCheck::Save();
          pHVar15 = ScriptContext::GetHostScriptContext((ScriptContext *)se.bstrLine);
          ppvVar12 = Memory::WriteBarrierPtr::operator_cast_to_void__
                               ((WriteBarrierPtr *)&this->errorObject);
          (*pHVar15->_vptr_HostScriptContext[0x14])(pHVar15,this,*ppvVar12);
          ExceptionCheck::Restore(&local_1d4);
        }
        this->hadNotifyHostReady = true;
      }
      Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentAsNeeded\n");
      NotifyParentsAsNeeded(this);
    }
    this_local._4_4_ = (HRESULT)scriptContext;
  }
  else {
    pJVar4 = ScriptContext::GetLibrary((ScriptContext *)se.bstrLine);
    local_c8 = JavascriptLibrary::CreateError(pJVar4);
    JavascriptError::SetErrorMessageProperties
              (local_c8,0,L"ES6Module not supported",(ScriptContext *)se.bstrLine);
    *exceptionVar = local_c8;
    this_local._4_4_ = -0x7fffbfff;
  }
LAB_010153b2:
  moduleName._4_4_ = 1;
  CompileScriptException::~CompileScriptException((CompileScriptException *)&allocator);
  return this_local._4_4_;
}

Assistant:

HRESULT SourceTextModuleRecord::ParseSource(__in_bcount(sourceLength) byte* sourceText, uint32 sourceLength, SRCINFO * srcInfo, Var* exceptionVar, bool isUtf8)
    {
        Assert(!wasParsed || sourceText == nullptr);
        Assert(parser == nullptr);
        Assert(exceptionVar != nullptr);
        HRESULT hr = NOERROR;

        // Return if loading failure has been reported
        if (sourceText == nullptr && wasParsed)
        {
            return hr;
        }

        ScriptContext* scriptContext = GetScriptContext();
        CompileScriptException se;
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        *exceptionVar = nullptr;
        if (!scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            JavascriptError *pError = scriptContext->GetLibrary()->CreateError();
            JavascriptError::SetErrorMessageProperties(pError, hr, _u("ES6Module not supported"), scriptContext);
            *exceptionVar = pError;
            return E_NOTIMPL;
        }

        // Mark module as root module if it currently has no parents
        // Note, if there are circular imports it may gain parents later
        if (parentModuleList == nullptr && promise == nullptr)
        {
            SetIsRootModule();
        }

        // Host indicates that the current module failed to load.
        if (sourceText == nullptr)
        {
            Assert(sourceLength == 0);
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("Failed to load: %s\n"), this->GetSpecifierSz());
            hr = E_FAIL;

            // We cannot just use the buffer in the specifier string - need to make a copy here.
            const char16* moduleName = this->GetSpecifierSz();
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            JavascriptError *pError = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(pError, hr, allocatedString, scriptContext);
            *exceptionVar = pError;
        }
        else
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ParseSource(%s)\n"), this->GetSpecifierSz());
            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
                this->parser = Anew(allocator, Parser, scriptContext);
                srcInfo->moduleID = moduleId;

                LoadScriptFlag loadScriptFlag = (LoadScriptFlag)(LoadScriptFlag_Expression | LoadScriptFlag_Module |
                    LoadScriptFlag_disableAsmJs | (isUtf8 ? LoadScriptFlag_Utf8Source : LoadScriptFlag_None));

                Utf8SourceInfo* pResultSourceInfo = nullptr;
                this->parseTree = scriptContext->ParseScript(parser, sourceText,
                    sourceLength, srcInfo, &se, &pResultSourceInfo, Constants::ModuleCode,
                    loadScriptFlag, &sourceIndex, nullptr);
                this->pSourceInfo = pResultSourceInfo;
            }
            catch (Js::OutOfMemoryException)
            {
                hr = E_OUTOFMEMORY;
            }
            catch (Js::StackOverflowException)
            {
                hr = VBSERR_OutOfStack;
            }

            if (FAILED(hr))
            {
                se.ProcessError(nullptr, hr, nullptr);
            }
            else if (parseTree == nullptr)
            {
                hr = E_FAIL;
            }
            else
            {
                hr = PostParseProcess();
                if (hr == S_OK && this->errorObject != nullptr && this->hadNotifyHostReady)
                {
                    // This would be the case where the child module got error and current module has notified error already.
                    if (*exceptionVar == nullptr)
                    {
                        *exceptionVar = this->errorObject;
                    }

                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    return E_FAIL;
                }
            }
        }

        if (FAILED(hr))
        {
            if (*exceptionVar == nullptr)
            {
                const WCHAR * sourceUrl = this->GetSpecifierSz();

                *exceptionVar = JavascriptError::CreateFromCompileScriptException(scriptContext, &se, sourceUrl);
            }
            // Cleanup in case of error.
            this->ReleaseParserResourcesForHierarchy();
            if (this->parser)
            {
                this->parseTree = nullptr;
                Adelete(allocator, this->parser);
                this->parser = nullptr;
            }
            if (this->errorObject == nullptr)
            {
                this->errorObject = *exceptionVar;
            }

            if (this->promise != nullptr)
            {
                SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, this->scriptContext, this, false);
            }

            // Notify host if current module is root module and the host hasn't been notified
            if (isRootModule && !hadNotifyHostReady)
            {
                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (ParseSource error)\n"), this->GetSpecifierSz());
                LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                {
                    scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                });

                hadNotifyHostReady = true;
            }

            // Notify parent if applicable
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentAsNeeded\n"));
            NotifyParentsAsNeeded();
        }
        return hr;
    }